

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O3

iDynTree * __thiscall
iDynTree::TransformFromDH(iDynTree *this,double a,double alpha,double d,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Position local_78 [24];
  Rotation local_60 [72];
  
  dVar1 = cos(theta);
  dVar2 = sin(theta);
  dVar3 = sin(alpha);
  dVar4 = cos(alpha);
  iDynTree::Rotation::Rotation
            (local_60,dVar1,-dVar2 * dVar4,dVar2 * dVar3,dVar2,dVar1 * dVar4,-dVar1 * dVar3,0.0,
             dVar3,dVar4);
  iDynTree::Position::Position(local_78,dVar1 * a,dVar2 * a,d);
  iDynTree::Transform::Transform((Transform *)this,local_60,local_78);
  return this;
}

Assistant:

Transform TransformFromDH(double a,double alpha,double d,double theta)
// returns Denavit-Hartenberg parameters (Non-Modified DH)
{
        double ct,st,ca,sa;
        ct = cos(theta);
        st = sin(theta);
        sa = sin(alpha);
        ca = cos(alpha);
        return Transform(Rotation(ct,    -st*ca,   st*sa,
                                  st,     ct*ca,  -ct*sa,
                                   0,        sa,      ca   ),
                         Position(a*ct,      a*st,  d));
}